

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68000_move_to_sr(m68k_info *info)

{
  cs_m68k *op;
  
  op = build_init_op(info,0x119,2,2);
  get_ea_mode_op(info,op->operands,info->ir,2);
  op->operands[1].address_mode = M68K_AM_NONE;
  op->operands[1].field_0.simm = 3.64338e-44;
  return;
}

Assistant:

static void d68000_move_to_sr(m68k_info *info)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_MOVE, 2, 2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, 2);

	op1->address_mode = M68K_AM_NONE;
	op1->reg = M68K_REG_SR;
}